

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
viface::VIfaceImpl::listStats_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VIfaceImpl *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long *plVar4;
  DIR *__dirp;
  dirent *pdVar5;
  size_t sVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  runtime_error *prVar10;
  long *plVar11;
  string entry;
  string path;
  ostringstream what;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator+(&local_1e8,"/sys/class/net/",&this->name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = &local_1b8;
  plVar11 = plVar4 + 2;
  if ((long *)*plVar4 == plVar11) {
    local_1b8 = *plVar11;
    lStack_1b0 = plVar4[3];
  }
  else {
    local_1b8 = *plVar11;
    local_1c8 = (long *)*plVar4;
  }
  local_1c0 = plVar4[1];
  *plVar4 = (long)plVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar2 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  __dirp = opendir((char *)local_1c8);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar5 = readdir(__dirp);
      if (pdVar5 == (dirent *)0x0) break;
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      sVar6 = strlen(pdVar5->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,pdVar5->d_name,pdVar5->d_name + sVar6);
      if (*local_1e8._M_dataplus._M_p != '.') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
    }
    iVar3 = closedir(__dirp);
    if (iVar3 == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->stats_keys_cache)._M_t,&__return_storage_ptr__->_M_t);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"--- Unable to close statistics folder for interface ",0x34);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,
                        (this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    Error: ",0xb);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::operator<<((ostream *)local_1a8,pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
    std::endl<char,std::char_traits<char>>(poVar7);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_1e8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"--- Unable to open statistics folder for interface ",0x33);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    Error: ",0xb);
  piVar8 = __errno_location();
  pcVar9 = strerror(*piVar8);
  std::operator<<((ostream *)local_1a8,pcVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
  std::endl<char,std::char_traits<char>>(poVar7);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar10,(string *)&local_1e8);
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::set<std::string> VIfaceImpl::listStats()
{
    set<string> result;

    DIR* dir;
    struct dirent* ent;
    ostringstream what;
    string path = "/sys/class/net/" + this->name + "/statistics/";

    // Open directory
    if ((dir = opendir(path.c_str())) == NULL) {
        what << "--- Unable to open statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // List files
    while ((ent = readdir(dir)) != NULL) {
        string entry(ent->d_name);

        // Ignore current, parent and hidden files
        if (entry[0] != '.') {
            result.insert(entry);
        }
    }

    // Close directory
    if (closedir(dir) != 0) {
        what << "--- Unable to close statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Update cache
    this->stats_keys_cache = result;

    return result;
}